

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

float optimal_encode(const_matchp mp,_encode_match_data *emd)

{
  unsigned_short uVar1;
  int *piVar2;
  undefined8 *puVar3;
  float fVar4;
  encode_match_privp data;
  float bits;
  interval_nodep *offset;
  _encode_match_data *emd_local;
  const_matchp mp_local;
  
  piVar2 = (int *)emd->priv;
  puVar3 = *(undefined8 **)(piVar2 + 10);
  if (mp->offset == 0) {
    data._4_4_ = (float)mp->len * 9.0 + 0.0;
    *piVar2 = (uint)mp->len + *piVar2;
    piVar2[3] = (int)(data._4_4_ + (float)piVar2[3]);
  }
  else {
    uVar1 = mp->len;
    if (uVar1 == 0) {
      if (~LOG_DEBUG < G_log_level) {
        G_log_log_level = LOG_ERROR;
        log_log_default("bad len\n");
      }
      exit(1);
    }
    if (uVar1 == 1) {
      fVar4 = (float)(**(code **)(piVar2 + 6))(mp->offset,*puVar3,emd->out);
      data._4_4_ = fVar4 + 1.0;
    }
    else if (uVar1 == 2) {
      fVar4 = (float)(**(code **)(piVar2 + 6))(mp->offset,puVar3[1],emd->out);
      data._4_4_ = fVar4 + 1.0;
    }
    else {
      fVar4 = (float)(**(code **)(piVar2 + 6))(mp->offset,puVar3[7],emd->out);
      data._4_4_ = fVar4 + 1.0;
    }
    fVar4 = (float)(**(code **)(piVar2 + 8))(mp->len,*(undefined8 *)(piVar2 + 0xc),emd->out);
    data._4_4_ = fVar4 + data._4_4_;
    if (data._4_4_ <= (float)mp->len * 9.0) {
      if (mp->offset == 1) {
        piVar2[2] = piVar2[2] + 1;
        piVar2[5] = (int)(data._4_4_ + (float)piVar2[5]);
      }
      else {
        piVar2[1] = piVar2[1] + 1;
        piVar2[4] = (int)(data._4_4_ + (float)piVar2[4]);
      }
    }
    else {
      *piVar2 = *piVar2 + 1;
      piVar2[3] = (int)(data._4_4_ + (float)piVar2[3]);
    }
  }
  return data._4_4_;
}

Assistant:

float optimal_encode(const_matchp mp, encode_match_data emd)
{
    interval_nodep *offset;
    float bits;
    encode_match_privp data;

    data = emd->priv;
    offset = data->offset_f_priv;

    bits = 0.0;
    if (mp->offset == 0)
    {
        bits += 9.0f * mp->len;
        data->lit_num += mp->len;
        data->lit_bits += bits;
    } else
    {
        bits += 1.0;
        switch (mp->len)
        {
        case 0:
            LOG(LOG_ERROR, ("bad len\n"));
            exit(1);
            break;
        case 1:
            bits += data->offset_f(mp->offset, offset[0], emd->out);
            break;
        case 2:
            bits += data->offset_f(mp->offset, offset[1], emd->out);
            break;
        default:
            bits += data->offset_f(mp->offset, offset[7], emd->out);
            break;
        }
        bits += data->len_f(mp->len, data->len_f_priv, emd->out);
        if (bits > (9.0 * mp->len))
        {
            /* lets make literals out of it */
            data->lit_num += 1;
            data->lit_bits += bits;
        } else
        {
            if (mp->offset == 1)
            {
                data->rle_num += 1;
                data->rle_bits += bits;
            } else
            {
                data->seq_num += 1;
                data->seq_bits += bits;
            }
        }
    }
    return bits;
}